

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O2

void __thiscall Tjen::Node::Node(Node *this,string *name)

{
  char local_19;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->transitions).
  super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->transitions).
  super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->transitions).
  super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::stack<char,std::deque<char,std::allocator<char>>>::
  stack<std::deque<char,std::allocator<char>>,void>(&this->stack);
  std::__cxx11::string::_M_assign((string *)this);
  local_19 = 'z';
  std::deque<char,_std::allocator<char>_>::emplace_back<char>(&(this->stack).c,&local_19);
  return;
}

Assistant:

Tjen::Node::Node(std::string name) {
    this->name = name;
    stack.push('z');

}